

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_cpio_newc.c
# Opt level: O0

void test_write_format_cpio_newc(void)

{
  int iVar1;
  wchar_t wVar2;
  la_ssize_t lVar3;
  int local_40 [2];
  size_t used;
  size_t buffsize;
  char *file;
  char *e;
  char *buff;
  archive_entry *entry;
  archive *a;
  
  used = 100000;
  e = (char *)malloc(100000);
  entry = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'<',(uint)(entry != (archive_entry *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_cpio_newc((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'=',0,"0",(long)iVar1,"archive_write_set_format_cpio_newc(a)",entry);
  iVar1 = archive_write_add_filter_none((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'>',0,"0",(long)iVar1,"archive_write_add_filter_none(a)",entry);
  iVar1 = archive_write_open_memory((archive *)entry,e,used,(size_t *)local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'?',0,"0",(long)iVar1,"archive_write_open_memory(a, buff, buffsize, &used)",
                      entry);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'G',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,1,10);
  archive_entry_set_pathname((archive_entry *)buff,"file");
  archive_entry_set_mode((archive_entry *)buff,0x81b4);
  archive_entry_set_size((archive_entry *)buff,10);
  archive_entry_set_uid((archive_entry *)buff,0x50);
  archive_entry_set_gid((archive_entry *)buff,0x5a);
  archive_entry_set_dev((archive_entry *)buff,0xc);
  archive_entry_set_ino((archive_entry *)buff,0x59);
  archive_entry_set_nlink((archive_entry *)buff,1);
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Q',0,"0",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  lVar3 = archive_write_data((archive *)entry,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'S',10,"10",lVar3,"archive_write_data(a, \"1234567890\", 10)",entry);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'V',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,2,0x14);
  archive_entry_set_pathname((archive_entry *)buff,"dir");
  archive_entry_set_mode((archive_entry *)buff,0x41fd);
  archive_entry_set_size((archive_entry *)buff,10);
  archive_entry_set_nlink((archive_entry *)buff,2);
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\\',0,"0",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  lVar3 = archive_write_data((archive *)entry,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'^',0,"0",lVar3,"archive_write_data(a, \"1234567890\", 10)",entry);
  buff = (char *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'a',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)buff,3,0x1e);
  archive_entry_set_pathname((archive_entry *)buff,"lnk");
  archive_entry_set_mode((archive_entry *)buff,0x1b4);
  archive_entry_set_filetype((archive_entry *)buff,0xa000);
  archive_entry_set_size((archive_entry *)buff,0);
  archive_entry_set_uid((archive_entry *)buff,0x53);
  archive_entry_set_gid((archive_entry *)buff,0x5d);
  archive_entry_set_dev((archive_entry *)buff,0xd);
  archive_entry_set_ino((archive_entry *)buff,0x58);
  archive_entry_set_nlink((archive_entry *)buff,1);
  archive_entry_set_symlink((archive_entry *)buff,"a");
  iVar1 = archive_write_header((archive *)entry,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'm',0,"0",(long)iVar1,"archive_write_header(a, entry)",entry);
  archive_entry_free((archive_entry *)buff);
  iVar1 = archive_write_free((archive *)entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  file = e;
  buffsize = (size_t)e;
  wVar2 = is_hex(e,0x6e);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'y',wVar2,"is_hex(e, 110)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'z',file,"e + 0","070701","\"070701\"",6,"6",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'{',(uint)(*(long *)(file + 6) != 0x3030303030303030),
                   "memcmp(e + 6, \"00000000\", 8) != 0",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'|',file + 0xe,"e + 14","000081b4","\"000081b4\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'}',file + 0x16,"e + 22","00000050","\"00000050\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'~',file + 0x1e,"e + 30","0000005a","\"0000005a\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x7f',file + 0x26,"e + 38","00000001","\"00000001\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x80',file + 0x2e,"e + 46","00000001","\"00000001\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x81',file + 0x36,"e + 54","0000000a","\"0000000a\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x82',file + 0x3e,"e + 62","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x83',file + 0x46,"e + 70","0000000c","\"0000000c\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x84',file + 0x4e,"e + 78","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x85',file + 0x56,"e + 86","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x86',file + 0x5e,"e + 94","00000005","\"00000005\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x87',file + 0x66,"e + 102","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x88',file + 0x6e,"e + 110","file","\"file\\0\\0\"",6,"6",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x89',file + 0x74,"e + 116","1234567890","\"1234567890\"",10,"10",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x8a',file + 0x7e,"e + 126","","\"\\0\\0\"",2,"2",(void *)0x0);
  file = file + 0x80;
  wVar2 = is_hex(file,0x6e);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'\x8e',wVar2,"is_hex(e, 110)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x8f',file,"e + 0","070701","\"070701\"",6,"6",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x90',file + 6,"e + 6","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x91',file + 0xe,"e + 14","000041fd","\"000041fd\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x92',file + 0x16,"e + 22","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x93',file + 0x1e,"e + 30","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x94',file + 0x26,"e + 38","00000002","\"00000002\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x95',file + 0x2e,"e + 46","00000002","\"00000002\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x96',file + 0x36,"e + 54","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x97',file + 0x3e,"e + 62","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x98',file + 0x46,"e + 70","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x99',file + 0x4e,"e + 78","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x9a',file + 0x56,"e + 86","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x9b',file + 0x5e,"e + 94","00000004","\"00000004\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x9c',file + 0x66,"e + 102","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x9d',file + 0x6e,"e + 110","dir","\"dir\\0\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'\x9e',file + 0x72,"e + 114","","\"\\0\\0\"",2,"2",(void *)0x0);
  file = file + 0x74;
  wVar2 = is_hex(file,0x6e);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'¢',wVar2,"is_hex(e, 110)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'£',file,"e + 0","070701","\"070701\"",6,"6",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'¤',(uint)(*(long *)(file + 6) != *(long *)(buffsize + 6)),
                   "memcmp(e + 6, file + 6, 8) != 0",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'¥',(uint)(*(long *)(file + 6) != 0x3030303030303030),
                   "memcmp(e + 6, \"00000000\", 8) != 0",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'¦',file + 0xe,"e + 14","0000a1b4","\"0000a1b4\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'§',file + 0x16,"e + 22","00000053","\"00000053\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'¨',file + 0x1e,"e + 30","0000005d","\"0000005d\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'©',file + 0x26,"e + 38","00000001","\"00000001\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'ª',file + 0x2e,"e + 46","00000003","\"00000003\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'«',file + 0x36,"e + 54","00000001","\"00000001\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'¬',file + 0x3e,"e + 62","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'­',file + 0x46,"e + 70","0000000d","\"0000000d\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'®',file + 0x4e,"e + 78","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'¯',file + 0x56,"e + 86","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'°',file + 0x5e,"e + 94","00000004","\"00000004\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'±',file + 0x66,"e + 102","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'²',file + 0x6e,"e + 110","lnk","\"lnk\\0\\0\\0\"",6,"6",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'³',file + 0x74,"e + 116","a","\"a\\0\\0\\0\"",4,"4",(void *)0x0);
  file = file + 0x78;
  wVar2 = is_hex(file,0x4c);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                   ,L'¹',wVar2,"is_hex(e, 76)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'º',file,"e + 0","070701","\"070701\"",6,"6",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'»',file + 6,"e + 6","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'¼',file + 0xe,"e + 14","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'½',file + 0x16,"e + 22","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'¾',file + 0x1e,"e + 30","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'¿',file + 0x26,"e + 38","00000001","\"00000001\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'À',file + 0x2e,"e + 46","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Á',file + 0x36,"e + 54","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Â',file + 0x3e,"e + 62","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Ã',file + 0x46,"e + 70","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Ä',file + 0x4e,"e + 78","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Å',file + 0x56,"e + 86","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Æ',file + 0x5e,"e + 94","0000000b","\"0000000b\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Ç',file + 0x66,"e + 102","00000000","\"00000000\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'È',file + 0x6e,"e + 110","TRAILER!!!","\"TRAILER!!!\\0\"",0xb,"11",
                      (void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'É',file + 0x79,"e + 121","","\"\\0\\0\\0\"",3,"3",(void *)0x0);
  file = file + 0x7c;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_cpio_newc.c"
                      ,L'Ì',(long)local_40[0],"(int)used",(long)file - (long)e,"e - buff",
                      (void *)0x0);
  free(e);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_cpio_newc)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e, *file;
	size_t buffsize = 100000;
	size_t used;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, 0, archive_write_set_format_cpio_newc(a));
	assertEqualIntA(a, 0, archive_write_add_filter_none(a));
	assertEqualIntA(a, 0, archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* Regular file */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Directory */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* Symlink */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "lnk");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 83);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 13);
	archive_entry_set_ino(entry, 88);
	archive_entry_set_nlink(entry, 1);
	archive_entry_set_symlink(entry,"a");
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	archive_entry_free(entry);

	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* First entry is "file" */
	file = e;
	assert(is_hex(e, 110)); /* Entire header is hex digits. */
	assertEqualMem(e + 0, "070701", 6); /* Magic */
	assert(memcmp(e + 6, "00000000", 8) != 0); /* ino != 0 */
	assertEqualMem(e + 14, "000081b4", 8); /* Mode */
	assertEqualMem(e + 22, "00000050", 8); /* uid */
	assertEqualMem(e + 30, "0000005a", 8); /* gid */
	assertEqualMem(e + 38, "00000001", 8); /* nlink */
	assertEqualMem(e + 46, "00000001", 8); /* mtime */
	assertEqualMem(e + 54, "0000000a", 8); /* File size */
	assertEqualMem(e + 62, "00000000", 8); /* devmajor */
	assertEqualMem(e + 70, "0000000c", 8); /* devminor */
	assertEqualMem(e + 78, "00000000", 8); /* rdevmajor */
	assertEqualMem(e + 86, "00000000", 8); /* rdevminor */
	assertEqualMem(e + 94, "00000005", 8); /* Name size */
	assertEqualMem(e + 102, "00000000", 8); /* CRC */
	assertEqualMem(e + 110, "file\0\0", 6); /* Name contents */
	assertEqualMem(e + 116, "1234567890", 10); /* File body */
	assertEqualMem(e + 126, "\0\0", 2); /* Pad to multiple of 4 */
	e += 128; /* Must be multiple of four here! */

	/* Second entry is "dir" */
	assert(is_hex(e, 110));
	assertEqualMem(e + 0, "070701", 6); /* Magic */
	assertEqualMem(e + 6, "00000000", 8); /* ino */
	assertEqualMem(e + 14, "000041fd", 8); /* Mode */
	assertEqualMem(e + 22, "00000000", 8); /* uid */
	assertEqualMem(e + 30, "00000000", 8); /* gid */
	assertEqualMem(e + 38, "00000002", 8); /* nlink */
	assertEqualMem(e + 46, "00000002", 8); /* mtime */
	assertEqualMem(e + 54, "00000000", 8); /* File size */
	assertEqualMem(e + 62, "00000000", 8); /* devmajor */
	assertEqualMem(e + 70, "00000000", 8); /* devminor */
	assertEqualMem(e + 78, "00000000", 8); /* rdevmajor */
	assertEqualMem(e + 86, "00000000", 8); /* rdevminor */
	assertEqualMem(e + 94, "00000004", 8); /* Name size */
	assertEqualMem(e + 102, "00000000", 8); /* CRC */
	assertEqualMem(e + 110, "dir\0", 4); /* name */
	assertEqualMem(e + 114, "\0\0", 2); /* Pad to multiple of 4 */
	e += 116; /* Must be multiple of four here! */

	/* Third entry is "lnk" */
	assert(is_hex(e, 110)); /* Entire header is hex digits. */
	assertEqualMem(e + 0, "070701", 6); /* Magic */
	assert(memcmp(e + 6, file + 6, 8) != 0); /* ino != file ino */
	assert(memcmp(e + 6, "00000000", 8) != 0); /* ino != 0 */
	assertEqualMem(e + 14, "0000a1b4", 8); /* Mode */
	assertEqualMem(e + 22, "00000053", 8); /* uid */
	assertEqualMem(e + 30, "0000005d", 8); /* gid */
	assertEqualMem(e + 38, "00000001", 8); /* nlink */
	assertEqualMem(e + 46, "00000003", 8); /* mtime */
	assertEqualMem(e + 54, "00000001", 8); /* File size */
	assertEqualMem(e + 62, "00000000", 8); /* devmajor */
	assertEqualMem(e + 70, "0000000d", 8); /* devminor */
	assertEqualMem(e + 78, "00000000", 8); /* rdevmajor */
	assertEqualMem(e + 86, "00000000", 8); /* rdevminor */
	assertEqualMem(e + 94, "00000004", 8); /* Name size */
	assertEqualMem(e + 102, "00000000", 8); /* CRC */
	assertEqualMem(e + 110, "lnk\0\0\0", 6); /* Name contents */
	assertEqualMem(e + 116, "a\0\0\0", 4); /* File body + pad */
	e += 120; /* Must be multiple of four here! */

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_hex(e, 76));
	assertEqualMem(e + 0, "070701", 6); /* Magic */
	assertEqualMem(e + 6, "00000000", 8); /* ino */
	assertEqualMem(e + 14, "00000000", 8); /* Mode */
	assertEqualMem(e + 22, "00000000", 8); /* uid */
	assertEqualMem(e + 30, "00000000", 8); /* gid */
	assertEqualMem(e + 38, "00000001", 8); /* nlink */
	assertEqualMem(e + 46, "00000000", 8); /* mtime */
	assertEqualMem(e + 54, "00000000", 8); /* File size */
	assertEqualMem(e + 62, "00000000", 8); /* devmajor */
	assertEqualMem(e + 70, "00000000", 8); /* devminor */
	assertEqualMem(e + 78, "00000000", 8); /* rdevmajor */
	assertEqualMem(e + 86, "00000000", 8); /* rdevminor */
	assertEqualMem(e + 94, "0000000b", 8); /* Name size */
	assertEqualMem(e + 102, "00000000", 8); /* CRC */
	assertEqualMem(e + 110, "TRAILER!!!\0", 11); /* Name */
	assertEqualMem(e + 121, "\0\0\0", 3); /* Pad to multiple of 4 bytes */
	e += 124; /* Must be multiple of four here! */

	assertEqualInt((int)used, e - buff);

	free(buff);
}